

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O2

void __thiscall
mocker::nasm::Section::
emplaceInst<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::NumericConstant>>
          (Section *this,OpType *args,shared_ptr<mocker::nasm::Register> *args_1,
          shared_ptr<mocker::nasm::NumericConstant> *args_2)

{
  allocator<char> local_49;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_49);
  emplaceLine<mocker::nasm::BinaryInst,mocker::nasm::BinaryInst::OpType,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::NumericConstant>>
            (this,&local_48,args,args_1,args_2);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void emplaceInst(Args &&... args) {
    emplaceLine<Type>("", std::forward<Args>(args)...);
  }